

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

sexp_conflict
sexp_string_3e_utf8_x_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg2)

{
  sexp_conflict psVar1;
  
  if ((((ulong)arg2 & 3) == 0) && (arg2->tag == 9)) {
    return (sexp_conflict)(arg2->value).flonum;
  }
  psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,9);
  return psVar1;
}

Assistant:

sexp sexp_string_to_utf8_x (sexp ctx, sexp self, sexp str) {
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
#if SEXP_USE_PACKED_STRINGS
  return sexp_string_to_utf8(ctx, self, str);
#else
  return sexp_string_bytes(str);
#endif
}